

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_console.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int playersNum;
  ostream *poVar2;
  char *addr;
  char *name;
  char *pcVar3;
  ComplexBot complexBot;
  Runner runner;
  
  if (argc < 2) {
    playersNum = 4;
    pcVar3 = "wg-forge3";
    iVar1 = 0x1bb;
    addr = "wgforge-srv.wargaming.net";
    name = "Tiger";
LAB_00153baa:
    tiger::trains::Runner::Runner(&runner,name,addr,iVar1,pcVar3,playersNum);
    tiger::trains::ai::ComplexBot::ComplexBot(&complexBot);
    tiger::trains::Runner::setBot(&runner,&complexBot.super_IBot);
    tiger::trains::Runner::run(&runner);
    tiger::trains::ai::ComplexBot::~ComplexBot(&complexBot);
    tiger::trains::Runner::~Runner(&runner);
    iVar1 = 0;
  }
  else {
    if (argc == 6) {
      iVar1 = atoi(argv[3]);
      if (iVar1 == 0) {
        pcVar3 = "Invalid port.";
      }
      else {
        playersNum = atoi(argv[5]);
        if (playersNum != 0) {
          pcVar3 = argv[4];
          name = argv[1];
          addr = argv[2];
          goto LAB_00153baa;
        }
        pcVar3 = "Invalid players num.";
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Wrong number of arguments.");
      std::endl<char,std::char_traits<char>>(poVar2);
      pcVar3 = "Usage:  console (login) (host) (port) (game) (playersNum)";
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

INITIALIZE_EASYLOGGINGPP


int main(int argc, char *argv[]){

    const char * login = "Tiger";
    const char * host = "wgforge-srv.wargaming.net";
    int port = 443;
    const char *gameName = "wg-forge3";
    int playersNum = 4;

    if (argc > 1){
        if (argc != 6){
            std::cerr << "Wrong number of arguments." << std::endl;
            std::cerr << "Usage:  console (login) (host) (port) (game) (playersNum)" << std::endl;
            return -1;
        }

        login = argv[1];
        host = argv[2];
        port = atoi(argv[3]);
        gameName = argv[4];
        playersNum = atoi(argv[5]);

        if (!port){
            std::cerr << "Invalid port." << std::endl;
            return -1;
        }

        if (!playersNum)
        {
            std::cerr << "Invalid players num." << std::endl;
            return -1;
        }
    }

    Runner runner(login, host, port, gameName, playersNum);
    ai::ComplexBot complexBot;
    runner.setBot(&complexBot);

    runner.run();

    return 0;
}